

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O1

void __thiscall unitOps_normal_Test::~unitOps_normal_Test(unitOps_normal_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, normal)
{
    EXPECT_FALSE(isnormal(invalid));
    EXPECT_FALSE(isnormal(defunit));
    EXPECT_FALSE(isnormal(error));
    EXPECT_TRUE(isnormal(V));
    auto zunit = unit(0.0, m);
    auto nunit = kg / zunit;
    EXPECT_FALSE(isnormal(nunit));
    EXPECT_FALSE(isnormal(unit_cast(precise_unit(nunit))));
    EXPECT_FALSE(isnormal(unit(std::numeric_limits<double>::infinity(), m)));
    EXPECT_FALSE(isnormal(unit(-std::numeric_limits<double>::infinity(), m)));
    auto zunit2 = unit(0.0, kg);
    auto nunit2 = zunit2 / zunit;
    EXPECT_FALSE(isnormal(nunit2));
    EXPECT_FALSE(isnormal(unit(-0.25, kg)));
    EXPECT_FALSE(isnormal(unit(1.4e-42, kg * m)));
    EXPECT_TRUE(isnormal(unit(1.4e-36, kg * m)));
    EXPECT_FALSE(isnormal(zunit2));
    EXPECT_FALSE(isnormal(unit_cast(precise::invalid)));

    EXPECT_TRUE(isnormal(m));
    EXPECT_TRUE(isnormal(m * milli));
}